

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

void helics::helicsGetVector(string_view val,vector<double,_std::allocator<double>_> *data)

{
  char cVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  char *in_RCX;
  int iVar7;
  uint uVar8;
  bool bVar9;
  size_t extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double dVar10;
  string_view val_00;
  string_view V;
  string_view val_01;
  string_view val_02;
  string_view val_03;
  string_view trimCharacters;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  basic_string_view<char,_std::char_traits<char>_> vstr;
  string_view val_local;
  double vectorVal;
  char *extraout_RDX;
  
  val_00._M_len = val._M_str;
  val_local._M_len = val._M_len;
  val_local._M_str = val_00._M_len;
  if ((helics *)val_local._M_len == (helics *)0x0) {
    std::vector<double,_std::allocator<double>_>::resize(data,0);
    return;
  }
  cVar1 = *val_00._M_len;
  if (cVar1 != 'v') {
    if (cVar1 == 'c') {
      val_01._M_str = (char *)data;
      val_01._M_len = (size_t)val_00._M_len;
      iVar4 = readSize((helics *)val_local._M_len,val_01);
      std::vector<double,_std::allocator<double>_>::reserve(data,(long)iVar4 * 2);
      std::vector<double,_std::allocator<double>_>::resize(data,0);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,'[',0);
      iVar7 = 0;
      if (0 < iVar4) {
        iVar7 = iVar4;
      }
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,",;]",
                           sVar5 + 1);
        bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,sVar5 + 1
                            ,~sVar5 + sVar6);
        val_02._M_str = bVar11._M_str;
        val_02._M_len = (size_t)val_02._M_str;
        helicsGetComplex((helics *)bVar11._M_len,val_02);
        vstr._M_len = extraout_XMM0_Qa;
        dVar10 = in_XMM1_Qa;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,(double *)&vstr);
        vstr._M_len = (size_t)in_XMM1_Qa;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,(double *)&vstr);
        sVar5 = sVar6;
        in_XMM1_Qa = dVar10;
      }
      return;
    }
    if (cVar1 != '[') {
      val_03._M_str = (char *)data;
      val_03._M_len = (size_t)val_00._M_len;
      helicsGetComplex((helics *)val_local._M_len,val_03);
      if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) {
        std::vector<double,_std::allocator<double>_>::resize(data,1);
        *(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_start = extraout_XMM0_Qa_00;
        return;
      }
      std::vector<double,_std::allocator<double>_>::resize(data,2);
      pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar2 = extraout_XMM0_Qa_00;
      pdVar2[1] = in_XMM1_Qa;
      return;
    }
  }
  val_00._M_str = (char *)data;
  uVar3 = readSize((helics *)val_local._M_len,val_00);
  if (0 < (int)uVar3) {
    std::vector<double,_std::allocator<double>_>::reserve(data,(ulong)uVar3);
  }
  std::vector<double,_std::allocator<double>_>::resize(data,0);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,'[',0);
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = uVar3;
  }
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,";,]",
                       sVar5 + 1);
    vstr = std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,sVar5 + 1,
                      ~sVar5 + sVar6);
    trimCharacters._M_str = in_RCX;
    trimCharacters._M_len = (size_t)" \t\n\r";
    gmlc::utilities::string_viewOps::trimString
              ((string_viewOps *)&vstr,(string_view *)0x4,trimCharacters);
    V._M_str = extraout_RDX;
    V._M_len = (size_t)vstr._M_str;
    vectorVal = gmlc::utilities::numeric_conversion<double>((utilities *)vstr._M_len,V,-1e+49);
    std::vector<double,_std::allocator<double>_>::push_back(data,&vectorVal);
    sVar5 = sVar6;
  }
  return;
}

Assistant:

void helicsGetVector(std::string_view val, std::vector<double>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v' || val.front() == '[') {
        auto size = readSize(val);
        if (size > 0) {
            data.reserve(size);
        }
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(";,]", firstBracket + 1);

            auto vstr = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
            string_viewOps::trimString(vstr);
            auto vectorVal = numeric_conversion<double>(vstr, invalidValue<double>());
            data.push_back(vectorVal);

            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(static_cast<std::size_t>(size) * 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto vectorVal =
                helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(vectorVal.real());
            data.push_back(vectorVal.imag());
            firstBracket = nextChar;
        }
    } else {
        auto cval = helicsGetComplex(val);
        if (cval.imag() == 0) {
            data.resize(1);
            data[0] = cval.real();
        } else {
            data.resize(2);
            data[0] = cval.real();
            data[1] = cval.imag();
        }
    }
}